

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

bool __thiscall
slang::ast::SpecifyBlockSymbol::checkPathTerminal
          (SpecifyBlockSymbol *this,ValueSymbol *terminal,Type *type,Scope *specifyParent,
          SpecifyTerminalDir dir,SourceRange sourceRange)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *pSVar3;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  bool bVar4;
  Diagnostic *pDVar5;
  undefined4 in_register_00000084;
  SourceLocation in_R9;
  anon_class_32_4_2c8b6779 reportErr;
  SpecifyTerminalDir local_4c;
  SourceRange local_48;
  anon_class_32_4_2c8b6779 local_38;
  
  local_48.startLoc._4_4_ = in_register_00000084;
  local_48.startLoc._0_4_ = dir;
  local_4c = (SpecifyTerminalDir)specifyParent;
  local_48.endLoc = in_R9;
  bVar4 = Type::isIntegral((Type *)terminal);
  if (bVar4) {
    local_38.dir = &local_4c;
    local_38.sourceRange = &local_48;
    SVar1 = (this->super_Symbol).kind;
    local_38.specifyParent = (Scope *)type;
    local_38.terminal = (ValueSymbol *)this;
    if (SVar1 == ModportPort) {
      iVar2 = *(int *)&this[2].super_Scope.lastMember;
      if (iVar2 == 2) {
        return true;
      }
      if ((iVar2 == 0 || local_4c != Input) && (iVar2 == 1 || local_4c != Output)) {
        return true;
      }
    }
    else if ((SVar1 == Net) || (local_4c != Input && SVar1 == Variable)) {
      pSVar3 = ((this->super_Symbol).parentScope)->thisSym;
      if ((pSVar3->kind == InstanceBody) && (*(int *)(pSVar3[2].name._M_str + 0x48) == 1)) {
        return true;
      }
      if (pSVar3 != (Symbol *)(type->super_Symbol).name._M_len) {
        sourceRange_01.endLoc = local_48.endLoc;
        sourceRange_01.startLoc = local_48.startLoc;
        Scope::addDiag((Scope *)type,(DiagCode)0x640006,sourceRange_01);
        return false;
      }
      if (local_4c != Both) {
        pSVar3 = this[2].super_Scope.firstMember;
        while( true ) {
          if (pSVar3 == (Symbol *)0x0) {
            checkPathTerminal::anon_class_32_4_2c8b6779::operator()(&local_38);
            return false;
          }
          iVar2 = *(int *)(*(long *)pSVar3 + 0x50);
          if (iVar2 == 2) {
            return true;
          }
          if (iVar2 == 0 && local_4c == Input) {
            return true;
          }
          if (iVar2 == 1 && local_4c == Output) break;
          pSVar3 = (Symbol *)(pSVar3->name)._M_len;
        }
        return true;
      }
      return true;
    }
    sourceRange_02.endLoc = local_48.endLoc;
    sourceRange_02.startLoc = local_48.startLoc;
    pDVar5 = Scope::addDiag((Scope *)type,(DiagCode)((uint)(local_4c == Input) * 0x20000 + 0x630006)
                            ,sourceRange_02);
    pDVar5 = Diagnostic::operator<<(pDVar5,(this->super_Symbol).name);
    Diagnostic::addNote(pDVar5,(DiagCode)0x50001,(this->super_Symbol).location);
  }
  else {
    if ((terminal->declaredType).parent == (Symbol *)0x0) {
      Type::resolveCanonical((Type *)terminal);
    }
    if (((terminal->declaredType).parent)->kind != ErrorType) {
      sourceRange_00.endLoc = local_48.endLoc;
      sourceRange_00.startLoc = local_48.startLoc;
      pDVar5 = Scope::addDiag((Scope *)type,(DiagCode)0x660006,sourceRange_00);
      pDVar5 = Diagnostic::operator<<(pDVar5,(this->super_Symbol).name);
      ast::operator<<(pDVar5,(Type *)terminal);
    }
  }
  return false;
}

Assistant:

bool SpecifyBlockSymbol::checkPathTerminal(const ValueSymbol& terminal, const Type& type,
                                           const Scope& specifyParent, SpecifyTerminalDir dir,
                                           SourceRange sourceRange) {
    // Type must be integral.
    if (!type.isIntegral()) {
        if (!type.isError())
            specifyParent.addDiag(diag::InvalidSpecifyType, sourceRange) << terminal.name << type;
        return false;
    }

    auto reportErr = [&] {
        auto code = dir == SpecifyTerminalDir::Input ? diag::InvalidSpecifySource
                                                     : diag::InvalidSpecifyDest;
        auto& diag = specifyParent.addDiag(code, sourceRange) << terminal.name;
        diag.addNote(diag::NoteDeclarationHere, terminal.location);
    };

    // Inputs must be nets (or modport ports) and outputs must
    // be nets or variables (or modport ports).
    if (terminal.kind != SymbolKind::Net && terminal.kind != SymbolKind::ModportPort &&
        (terminal.kind != SymbolKind::Variable || dir == SpecifyTerminalDir::Input)) {
        reportErr();
        return false;
    }

    if (terminal.kind == SymbolKind::ModportPort) {
        // Check that the modport port has the correct direction.
        auto portDir = terminal.as<ModportPortSymbol>().direction;
        if (portDir != ArgumentDirection::InOut &&
            ((dir == SpecifyTerminalDir::Input && portDir != ArgumentDirection::In) ||
             (dir == SpecifyTerminalDir::Output && portDir != ArgumentDirection::Out))) {
            reportErr();
            return false;
        }
        return true;
    }

    auto terminalParentScope = terminal.getParentScope();
    SLANG_ASSERT(terminalParentScope);

    auto& terminalParent = terminalParentScope->asSymbol();
    if (terminalParent.kind == SymbolKind::InstanceBody &&
        terminalParent.as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface) {
        // If the signal is part of an interface then the only way we could have accessed
        // it is through an interface port, in which case the direction is "inout" and
        // therefore fine no matter whether this is an input or output terminal.
        return true;
    }

    // If we get here then the terminal must be a member of the module containing
    // our parent specify block.
    if (&terminalParent != &specifyParent.asSymbol()) {
        specifyParent.addDiag(diag::InvalidSpecifyPath, sourceRange);
        return false;
    }

    if (dir == SpecifyTerminalDir::Both)
        return true;

    // Check that the terminal is connected to a module port and that
    // the direction is correct.
    for (auto portRef = terminal.getFirstPortBackref(); portRef;
         portRef = portRef->getNextBackreference()) {
        auto portDir = portRef->port->direction;
        if (portDir == ArgumentDirection::InOut ||
            (dir == SpecifyTerminalDir::Input && portDir == ArgumentDirection::In) ||
            (dir == SpecifyTerminalDir::Output && portDir == ArgumentDirection::Out)) {
            return true;
        }
    }

    reportErr();
    return false;
}